

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O3

void mat_inf_norm_cols_sym_triu(csc *M,c_float *E)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  c_int *pcVar4;
  c_float *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  lVar1 = M->n;
  if (0 < lVar1) {
    lVar8 = 0;
    memset(E,0,lVar1 * 8);
    plVar2 = M->p;
    lVar7 = *plVar2;
    do {
      lVar3 = plVar2[lVar8 + 1];
      if (lVar7 < lVar3) {
        pcVar4 = M->i;
        pcVar5 = M->x;
        do {
          lVar6 = pcVar4[lVar7];
          dVar10 = pcVar5[lVar7];
          dVar9 = -dVar10;
          if (-dVar10 <= dVar10) {
            dVar9 = dVar10;
          }
          dVar10 = dVar9;
          if (dVar9 <= E[lVar8]) {
            dVar10 = E[lVar8];
          }
          E[lVar8] = dVar10;
          if (lVar6 != lVar8) {
            if (dVar9 <= E[lVar6]) {
              dVar9 = E[lVar6];
            }
            E[lVar6] = dVar9;
          }
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar3;
    } while (lVar8 != lVar1);
  }
  return;
}

Assistant:

void mat_inf_norm_cols_sym_triu(const csc *M, c_float *E) {
  c_int   i, j, ptr;
  c_float abs_x;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  // Note that element (i, j) contributes to
  // -> Column j (as expected in any matrices)
  // -> Column i (which is equal to row i for symmetric matrices)
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i     = M->i[ptr];
      abs_x = c_absval(M->x[ptr]);
      E[j]  = c_max(abs_x, E[j]);

      if (i != j) {
        E[i] = c_max(abs_x, E[i]);
      }
    }
  }
}